

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binning.cpp
# Opt level: O1

vector<duckdb::PrimitiveType<long>,_true> *
duckdb::EquiWidthBinsInteger::Operation
          (vector<duckdb::PrimitiveType<long>,_true> *__return_storage_ptr__,Expression *expr,
          int64_t input_min,int64_t input_max,idx_t bin_count,bool nice_rounding)

{
  pointer pPVar1;
  pointer pPVar2;
  iterator __position;
  undefined1 auVar3 [16];
  uint64_t uVar4;
  bool bVar5;
  reference pvVar6;
  int64_t *result;
  hugeint_t hVar7;
  hugeint_t input;
  hugeint_t max;
  hugeint_t new_step;
  hugeint_t new_max;
  hugeint_t span;
  hugeint_t min;
  hugeint_t step;
  hugeint_t FACTOR;
  ulong local_c0;
  hugeint_t local_b8;
  hugeint_t local_a8;
  hugeint_t local_98;
  hugeint_t local_88;
  hugeint_t local_78;
  hugeint_t local_68;
  hugeint_t local_50;
  hugeint_t local_40;
  
  (__return_storage_ptr__->
  super_vector<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>).
  super__Vector_base<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>).
  super__Vector_base<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>).
  super__Vector_base<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  hugeint_t::hugeint_t(&local_50,1000);
  hugeint_t::hugeint_t(&local_b8,input_min);
  local_78 = hugeint_t::operator*(&local_b8,&local_50);
  hugeint_t::hugeint_t(&local_88,input_max);
  local_b8 = hugeint_t::operator*(&local_88,&local_50);
  local_88 = hugeint_t::operator-(&local_b8,&local_78);
  local_a8 = Hugeint::Convert<unsigned_long>(bin_count);
  local_68 = hugeint_t::operator/(&local_88,&local_a8);
  result = (int64_t *)local_68.upper;
  local_c0 = bin_count;
  if (nice_rounding) {
    local_a8 = MakeNumberNice(local_68,local_68,ROUND);
    result = (int64_t *)local_a8.upper;
    local_98 = RoundToNumber(local_b8,local_a8,CEILING);
    bVar5 = hugeint_t::operator!=(&local_98,&local_78);
    if (bVar5) {
      hugeint_t::hugeint_t(&local_40,0);
      bVar5 = hugeint_t::operator!=(&local_a8,&local_40);
      if (bVar5) {
        local_b8 = local_98;
        local_68 = local_a8;
      }
    }
    local_c0 = bin_count * 2;
  }
  local_a8 = local_b8;
  do {
    bVar5 = hugeint_t::operator>(&local_a8,&local_78);
    if (!bVar5) {
      return __return_storage_ptr__;
    }
    hVar7 = hugeint_t::operator/(&local_a8,&local_50);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_98.upper;
    local_98 = (hugeint_t)(auVar3 << 0x40);
    input.upper = (int64_t)&local_98;
    input.lower = hVar7.upper;
    Hugeint::TryCast<long>((Hugeint *)hVar7.lower,input,result);
    uVar4 = local_98.lower;
    pPVar1 = (__return_storage_ptr__->
             super_vector<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>
             ).
             super__Vector_base<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pPVar2 = (__return_storage_ptr__->
             super_vector<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>
             ).
             super__Vector_base<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pPVar1 == pPVar2) {
LAB_01a92e3e:
      local_98 = (hugeint_t)CONCAT88(local_98.upper,uVar4);
      __position._M_current =
           (__return_storage_ptr__->
           super_vector<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>)
           .
           super__Vector_base<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->
          super_vector<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>).
          super__Vector_base<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<duckdb::PrimitiveType<long>,std::allocator<duckdb::PrimitiveType<long>>>::
        _M_realloc_insert<duckdb::PrimitiveType<long>>
                  ((vector<duckdb::PrimitiveType<long>,std::allocator<duckdb::PrimitiveType<long>>>
                    *)__return_storage_ptr__,__position,(PrimitiveType<long> *)&local_98);
      }
      else {
        (__position._M_current)->val = uVar4;
        (__return_storage_ptr__->
        super_vector<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>).
        super__Vector_base<duckdb::PrimitiveType<long>,_std::allocator<duckdb::PrimitiveType<long>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      result = (int64_t *)0x0;
    }
    else {
      result = (int64_t *)0x2;
      if ((input_min <= (long)local_98.lower) &&
         ((ulong)((long)pPVar2 - (long)pPVar1 >> 3) < local_c0)) {
        pvVar6 = vector<duckdb::PrimitiveType<long>,_true>::back(__return_storage_ptr__);
        result = (int64_t *)0x4;
        if (uVar4 != pvVar6->val) goto LAB_01a92e3e;
      }
    }
    if (((ulong)result & 3) != 0) {
      return __return_storage_ptr__;
    }
    hugeint_t::operator-=(&local_a8,&local_68);
  } while( true );
}

Assistant:

static vector<PrimitiveType<int64_t>> Operation(const Expression &expr, int64_t input_min, int64_t input_max,
	                                                idx_t bin_count, bool nice_rounding) {
		vector<PrimitiveType<int64_t>> result;
		// to prevent integer truncation from affecting the bin boundaries we calculate them with numbers multiplied by
		// 1000 we then divide to get the actual boundaries
		const auto FACTOR = hugeint_t(1000);
		auto min = hugeint_t(input_min) * FACTOR;
		auto max = hugeint_t(input_max) * FACTOR;

		const hugeint_t span = max - min;
		hugeint_t step = span / Hugeint::Convert(bin_count);
		if (nice_rounding) {
			// when doing nice rounding we try to make the max/step values nicer
			hugeint_t new_step = MakeNumberNice(step, step, NiceRounding::ROUND);
			hugeint_t new_max = RoundToNumber(max, new_step, NiceRounding::CEILING);
			if (new_max != min && new_step != 0) {
				max = new_max;
				step = new_step;
			}
			// we allow for more bins when doing nice rounding since the bin count is approximate
			bin_count *= 2;
		}
		for (hugeint_t bin_boundary = max; bin_boundary > min; bin_boundary -= step) {
			const hugeint_t target_boundary = bin_boundary / FACTOR;
			int64_t real_boundary = Hugeint::Cast<int64_t>(target_boundary);
			if (!result.empty()) {
				if (real_boundary < input_min || result.size() >= bin_count) {
					// we can never generate input_min
					break;
				}
				if (real_boundary == result.back().val) {
					// we cannot generate the same value multiple times in a row - skip this step
					continue;
				}
			}
			result.push_back(real_boundary);
		}
		return result;
	}